

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O3

StringRef llvm::yaml::ScalarTraits<unsigned_int,_void>::input
                    (StringRef Scalar,void *param_2,uint32_t *Val)

{
  bool bVar1;
  ulong in_RAX;
  char *pcVar2;
  size_t sVar3;
  unsigned_long_long *in_R8;
  StringRef Str;
  StringRef SVar4;
  ulong local_18;
  unsigned_long_long n;
  
  Str.Data = Scalar.Length;
  Str.Length = 0;
  local_18 = in_RAX;
  bVar1 = getAsUnsignedInteger((llvm *)Scalar.Data,Str,(uint)&local_18,in_R8);
  if (bVar1) {
    sVar3 = 0xe;
    pcVar2 = "invalid number";
  }
  else if (local_18 >> 0x20 == 0) {
    *Val = (uint32_t)local_18;
    pcVar2 = (char *)0x0;
    sVar3 = 0;
  }
  else {
    sVar3 = 0x13;
    pcVar2 = "out of range number";
  }
  SVar4.Length = sVar3;
  SVar4.Data = pcVar2;
  return SVar4;
}

Assistant:

StringRef ScalarTraits<uint32_t>::input(StringRef Scalar, void *,
                                        uint32_t &Val) {
  unsigned long long n;
  if (getAsUnsignedInteger(Scalar, 0, n))
    return "invalid number";
  if (n > 0xFFFFFFFFUL)
    return "out of range number";
  Val = n;
  return StringRef();
}